

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O1

void __thiscall Json_Move_Test::~Json_Move_Test(Json_Move_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (Json, Move) {
    StrictMock<mock_json_callbacks> callbacks;
    callbacks_proxy<mock_json_callbacks> proxy (callbacks);
    EXPECT_CALL (callbacks, null_value ()).Times (1);

    json::parser<decltype (proxy)> p (proxy);
    // Move to a new parser instance ('p2') from 'p' and make sure that 'p2' is usuable.
    auto p2 = std::move (p);
    p2.input (" null "s).eof ();
    EXPECT_FALSE (p2.has_error ());
    EXPECT_EQ (p2.coordinate (), (json::coord{7U, 1U}));
}